

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.h
# Opt level: O1

void __thiscall
VmBlock::VmBlock(VmBlock *this,Allocator *allocator,SynBase *source,InplaceStr name,uint uniqueId)

{
  (this->super_VmValue).typeID = 3;
  (this->super_VmValue).type.type = VM_TYPE_BLOCK;
  (this->super_VmValue).type.size = 4;
  (this->super_VmValue).type.structType = (TypeBase *)0x0;
  (this->super_VmValue).source = source;
  (this->super_VmValue).comment.begin = (char *)0x0;
  (this->super_VmValue).comment.end = (char *)0x0;
  (this->super_VmValue).users.allocator = allocator;
  (this->super_VmValue).users.data = (this->super_VmValue).users.little;
  (this->super_VmValue).users.count = 0;
  (this->super_VmValue).users.max = 8;
  (this->super_VmValue).hasSideEffects = false;
  (this->super_VmValue).hasMemoryAccess = false;
  (this->super_VmValue).canBeRemoved = true;
  (this->super_VmValue).hasKnownSimpleUse = false;
  (this->super_VmValue).hasKnownNonSimpleUse = false;
  (this->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmBlock_0022ad10;
  (this->name).begin = name.begin;
  (this->name).end = name.end;
  this->uniqueId = uniqueId;
  (this->predecessors).allocator = allocator;
  (this->predecessors).data = (this->predecessors).little;
  (this->predecessors).max = 4;
  (this->predecessors).count = 0;
  (this->successors).allocator = allocator;
  (this->successors).data = (this->successors).little;
  (this->successors).count = 0;
  (this->successors).max = 4;
  (this->dominanceFrontier).allocator = allocator;
  (this->dominanceFrontier).data = (this->dominanceFrontier).little;
  (this->dominanceFrontier).count = 0;
  (this->dominanceFrontier).max = 4;
  (this->dominanceChildren).allocator = allocator;
  (this->dominanceChildren).data = (this->dominanceChildren).little;
  (this->dominanceChildren).count = 0;
  (this->dominanceChildren).max = 4;
  (this->liveIn).allocator = allocator;
  (this->liveIn).data = (this->liveIn).little;
  (this->liveIn).count = 0;
  (this->liveIn).max = 4;
  (this->liveOut).allocator = allocator;
  (this->liveOut).data = (this->liveOut).little;
  (this->liveOut).count = 0;
  (this->liveOut).max = 4;
  this->lastInstruction = (VmInstruction *)0x0;
  this->insertPoint = (VmInstruction *)0x0;
  this->nextSibling = (VmBlock *)0x0;
  this->firstInstruction = (VmInstruction *)0x0;
  this->parent = (VmFunction *)0x0;
  this->prevSibling = (VmBlock *)0x0;
  this->address = 0xffffffff;
  this->visited = false;
  this->controlGraphPreOrderId = 0xffffffff;
  this->controlGraphPostOrderId = 0xffffffff;
  this->dominanceGraphPreOrderId = 0xffffffff;
  this->dominanceGraphPostOrderId = 0xffffffff;
  this->idom = (VmBlock *)0x0;
  this->hasAssignmentForId = 0;
  this->hasPhiNodeForId = 0;
  this->entryPc = (VmInstruction *)0x0;
  this->exitPc = (VmInstruction *)0x0;
  return;
}

Assistant:

VmValue(unsigned typeID, Allocator *allocator, VmType type, SynBase *source): typeID(typeID), type(type), source(source), users(allocator)
	{
		hasSideEffects = false;
		hasMemoryAccess = false;

		hasKnownSimpleUse = false;
		hasKnownNonSimpleUse = false;

		canBeRemoved = true;
	}